

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::extMul<2ul,int,long,(wasm::LaneOrder)0>
          (Literal *__return_storage_ptr__,wasm *this,Literal *a,Literal *b)

{
  bool bVar1;
  Literal *pLVar2;
  Literal *pLVar3;
  Literal *val;
  bool bVar4;
  long lVar5;
  Type *__return_storage_ptr___00;
  Type *__return_storage_ptr___01;
  undefined1 local_148 [8];
  LaneArray<2UL_*_2> lhs;
  LaneArray<2UL_*_2> rhs;
  LaneArray<2UL> result;
  anon_union_16_6_1532cd5a_for_Literal_0 local_50;
  undefined8 local_40;
  Literal *local_38;
  
  __return_storage_ptr___01 = (Type *)local_148;
  local_38 = __return_storage_ptr__;
  getLanes<int,4>((LaneArray<4> *)__return_storage_ptr___01,this,a);
  __return_storage_ptr___00 = &lhs._M_elems[3].type;
  getLanes<int,4>((LaneArray<4> *)__return_storage_ptr___00,(wasm *)a,val);
  result._M_elems[1].field_0.i64 = 0;
  result._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[0].type.id = 0;
  rhs._M_elems[3].type.id = 0;
  result._M_elems[0].field_0.i64 = 0;
  pLVar2 = rhs._M_elems + 3;
  bVar4 = true;
  while ((__return_storage_ptr___01[2].id == 2 && (*(long *)(__return_storage_ptr___00 + 2) == 2)))
  {
    local_50.i64 = (long)(int)__return_storage_ptr___00->id *
                   (long)(((Literal *)&__return_storage_ptr___01->id)->field_0).i32;
    local_40 = 3;
    Literal::~Literal((Literal *)&pLVar2->type);
    Literal::Literal((Literal *)&pLVar2->type,(Literal *)&local_50.func);
    Literal::~Literal((Literal *)&local_50.func);
    pLVar3 = local_38;
    pLVar2 = result._M_elems;
    __return_storage_ptr___00 = &rhs._M_elems[0].type;
    __return_storage_ptr___01 = &lhs._M_elems[0].type;
    bVar1 = !bVar4;
    bVar4 = false;
    if (bVar1) {
      Literal::Literal(local_38,(LaneArray<2> *)&rhs._M_elems[3].type);
      lVar5 = 0x18;
      do {
        Literal::~Literal((Literal *)((long)&rhs._M_elems[3].type.id + lVar5));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != -0x18);
      lVar5 = 0x48;
      do {
        Literal::~Literal((Literal *)((long)&lhs._M_elems[3].type.id + lVar5));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != -0x18);
      lVar5 = 0x48;
      do {
        Literal::~Literal((Literal *)(local_148 + lVar5));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != -0x18);
      return pLVar3;
    }
  }
  __assert_fail("type == Type::i32",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                ,0x120,"int32_t wasm::Literal::geti32() const");
}

Assistant:

Literal extMul(const Literal& a, const Literal& b) {
  LaneArray<Lanes* 2> lhs = getLanes<LaneFrom, Lanes * 2>(a);
  LaneArray<Lanes* 2> rhs = getLanes<LaneFrom, Lanes * 2>(b);
  LaneArray<Lanes> result;
  for (size_t i = 0; i < Lanes; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + Lanes;
    result[i] = Literal((LaneTo)(LaneFrom)lhs[idx].geti32() *
                        (LaneTo)(LaneFrom)rhs[idx].geti32());
  }
  return Literal(result);
}